

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::ScissorTestStateAPI::getScissorTestStates
          (ScissorTestStateAPI *this,GLint max_viewports,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  uchar uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  ulong uVar3;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (0 < max_viewports) {
    uVar3 = 0;
    do {
      uVar1 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0xc80))(0xc11,uVar3 & 0xffffffff);
      (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar3] = uVar1;
      err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
      glu::checkError(err,"isEnabledi",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0x9bc);
      uVar3 = uVar3 + 1;
    } while ((uint)max_viewports != uVar3);
  }
  return;
}

Assistant:

void ScissorTestStateAPI::getScissorTestStates(GLint max_viewports, std::vector<GLboolean>& out_data)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (GLint i = 0; i < max_viewports; ++i)
	{
		out_data[i] = gl.isEnabledi(GL_SCISSOR_TEST, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "isEnabledi");
	}
}